

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_block.c
# Opt level: O2

void sig_blocknone(void)

{
  sigset_t ss;
  
  sigemptyset((sigset_t *)&ss);
  sigprocmask(2,(sigset_t *)&ss,(sigset_t *)0x0);
  return;
}

Assistant:

void sig_blocknone(void)
{
#ifdef HASSIGPROCMASK
  sigset_t ss;
  sigemptyset(&ss);
  sigprocmask(SIG_SETMASK,&ss,(sigset_t *) 0);
#else
  sigsetmask(0);
#endif
}